

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CaseInsensitive::Transform::Apply<unsigned_int>(Transform *this,uint c,uint *outEquiv)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  undefined4 *puVar4;
  uint local_30;
  uint *outEquiv_local;
  uint c_local;
  Transform *this_local;
  
  if ((c < this->lo) || (this->hi < c)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x29,"(c >= lo && c <= hi)","c >= lo && c <= hi");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_30 = c;
  if ((this->lo + 1) % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    local_30 = c + this->delta0;
  }
  CVar3 = Chars<unsigned_int>::UTC(local_30);
  *outEquiv = CVar3;
  if (this->lo % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    CVar3 = Chars<unsigned_int>::ITC(c + this->delta1);
    outEquiv[1] = CVar3;
    CVar3 = Chars<unsigned_int>::ITC(c + this->delta2);
    outEquiv[2] = CVar3;
    CVar3 = Chars<unsigned_int>::ITC(c + this->delta3);
    outEquiv[3] = CVar3;
  }
  else {
    CVar3 = Chars<unsigned_int>::UTC(c);
    outEquiv[3] = CVar3;
    outEquiv[2] = CVar3;
    outEquiv[1] = CVar3;
  }
  return;
}

Assistant:

inline void Apply(uint c, Char outEquiv[EquivClassSize]) const
            {
                Assert(c >= lo && c <= hi);

                outEquiv[0] = Chars<Char>::UTC((lo + 1) % skipCountOfRange == c % skipCountOfRange ? (int)c + delta0 : c);

                CompileAssert(CaseInsensitive::EquivClassSize == 4);
                if (lo  % skipCountOfRange == c % skipCountOfRange)
                {
                    outEquiv[1] = Chars<Char>::ITC((int)c + delta1);
                    outEquiv[2] = Chars<Char>::ITC((int)c + delta2);
                    outEquiv[3] = Chars<Char>::ITC((int)c + delta3);
                }
                else
                {
                    outEquiv[1] = outEquiv[2] = outEquiv[3] = Chars<Char>::UTC(c);
                }
            }